

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O0

nh_bool ext_cmd_getlin_hook(char *base,void *hook_arg)

{
  char *__s2;
  int iVar1;
  size_t __n;
  extcmd_hook_args *hpa;
  wchar_t com_index;
  wchar_t oindex;
  void *hook_arg_local;
  char *base_local;
  
  hpa._0_4_ = -1;
  hpa._4_4_ = 0;
  do {
    if (*(int *)((long)hook_arg + 0x10) <= hpa._4_4_) {
      if (-1 < (int)hpa) {
        strcpy(base,*(char **)(*hook_arg + (long)(int)hpa * 8));
      }
      return -1 < (int)hpa;
    }
    __s2 = *(char **)(*hook_arg + (long)hpa._4_4_ * 8);
    __n = strlen(base);
    iVar1 = strncasecmp(base,__s2,__n);
    if (iVar1 == 0) {
      if ((int)hpa != -1) {
        return '\0';
      }
      hpa._0_4_ = hpa._4_4_;
    }
    hpa._4_4_ = hpa._4_4_ + 1;
  } while( true );
}

Assistant:

static nh_bool ext_cmd_getlin_hook(char *base, void *hook_arg)
{
    int oindex, com_index;
    struct extcmd_hook_args *hpa = hook_arg;

    com_index = -1;
    for (oindex = 0; oindex < hpa->listlen; oindex++) {
	if (!strncasecmp(base, hpa->namelist[oindex], strlen(base))) {
	    if (com_index == -1)	/* no matches yet */
		com_index = oindex;
	    else			/* more than 1 match */
		return FALSE;
	}
    }
    if (com_index >= 0) {
	strcpy(base, hpa->namelist[com_index]);
	return TRUE;
    }

    return FALSE;	/* didn't match anything */
}